

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O2

Aig_MmFlex_t * Aig_MmFlexStart(void)

{
  Aig_MmFlex_t *pAVar1;
  char **ppcVar2;
  
  pAVar1 = (Aig_MmFlex_t *)calloc(1,0x38);
  pAVar1->nChunkSize = 0x40000;
  pAVar1->nChunksAlloc = 0x40;
  ppcVar2 = (char **)malloc(0x200);
  pAVar1->pChunks = ppcVar2;
  return pAVar1;
}

Assistant:

Aig_MmFlex_t * Aig_MmFlexStart()
{
    Aig_MmFlex_t * p;

    p = ABC_ALLOC( Aig_MmFlex_t, 1 );
    memset( p, 0, sizeof(Aig_MmFlex_t) );

    p->nEntriesUsed  = 0;
    p->pCurrent      = NULL;
    p->pEnd          = NULL;

    p->nChunkSize    = (1 << 18);
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}